

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O1

void strings_equal<char>(string *n_c,string *n_original,string *iexpected,locale *l,string *domain)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *begin;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  runtime_error *prVar7;
  size_t __n;
  string *__n_00;
  void *__buf;
  void *__buf_00;
  bool bVar8;
  locale tmp_locale;
  string_type expected;
  string_type tmp;
  string_type c;
  string_type original;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  locale local_2f0;
  string local_2e8;
  undefined1 local_2c8 [32];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  string_type local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  locale local_1e8;
  undefined1 local_1e0 [32];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [16];
  locale local_68;
  locale local_60;
  locale local_58;
  locale local_50;
  locale local_48;
  locale local_40;
  locale local_38;
  
  std::locale::locale(&local_1e8,l);
  begin = (iexpected->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_2e8,begin,begin + iexpected->_M_string_length,&local_1e8,default_method);
  std::locale::~locale(&local_1e8);
  std::__cxx11::string::string
            ((string *)local_1e0,(n_original->_M_dataplus)._M_p,(allocator *)local_2c8);
  to<char>(&local_208,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  std::__cxx11::string::string((string *)local_1e0,(n_c->_M_dataplus)._M_p,(allocator *)local_2c8);
  to<char>(&local_228,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  iVar4 = std::__cxx11::string::compare((char *)domain);
  if (iVar4 != 0) goto LAB_0011576a;
  test_counter = test_counter + 1;
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_1e0,&local_228,&local_208);
  booster::locale::basic_message<char>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<char> *)local_1e0,l,0);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," bl::translate(c,original).str(l)==expected",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_1e0._0_8_ = (ulong)(uint)local_1e0._4_4_ << 0x20;
  local_1e0._8_8_ = local_208._M_dataplus._M_p;
  local_1e0._16_8_ = local_228._M_dataplus._M_p;
  local_1e0._24_8_ = 0;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = '\0';
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_178 = 0;
  local_170[0]._M_local_buf[0] = '\0';
  __n = 0;
  local_1c0._M_p = (pointer)&local_1b0;
  local_1a0._M_p = (pointer)&local_190;
  local_180._M_p = (pointer)local_170;
  booster::locale::basic_message<char>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<char> *)local_1e0,l,0);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  pcVar3 = local_1e0 + 0x10;
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xac);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," bl::translate(context_c_str,original_c_str).str(l)==expected",0x3d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar1 = error_counter + 1;
    __n = (size_t)uVar1;
    bVar8 = 0x14 < error_counter;
    error_counter = uVar1;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_2f0);
  std::locale::global(&local_38);
  std::locale::~locale(&local_38);
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_1e0,&local_228,&local_208);
  booster::locale::basic_message<char>::str_abi_cxx11_(&local_248,(basic_message<char> *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  test_counter = test_counter + 1;
  if (local_248._M_string_length == local_2e8._M_string_length) {
    if ((pointer)local_248._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_248._M_dataplus._M_p,local_2e8._M_dataplus._M_p,local_248._M_string_length)
      ;
      if (iVar4 != 0) goto LAB_001153c5;
    }
  }
  else {
LAB_001153c5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," tmp==expected",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar1 = error_counter + 1;
    __n = (size_t)uVar1;
    bVar8 = 0x14 < error_counter;
    error_counter = uVar1;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_1e0,&local_228,&local_208);
  booster::locale::basic_message<char>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<char> *)local_1e0);
  std::__cxx11::string::operator=((string *)&local_248,(string *)local_2c8);
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  test_counter = test_counter + 1;
  if (local_248._M_string_length == local_2e8._M_string_length) {
    if ((pointer)local_248._M_string_length != (pointer)0x0) {
      iVar4 = bcmp(local_248._M_dataplus._M_p,local_2e8._M_dataplus._M_p,local_248._M_string_length)
      ;
      if (iVar4 != 0) goto LAB_00115504;
    }
  }
  else {
LAB_00115504:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," tmp==expected",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar1 = error_counter + 1;
    __n = (size_t)uVar1;
    bVar8 = 0x14 < error_counter;
    error_counter = uVar1;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_40);
  std::locale::~locale(&local_40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  std::ios::imbue(&local_48);
  std::locale::~locale(&local_48);
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_2c8,&local_228,&local_208);
  booster::locale::basic_message<char>::write
            ((basic_message<char> *)local_2c8,(int)local_1e0,__buf,__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_2c8);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170[0]._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::locale::~locale(&local_2f0);
LAB_0011576a:
  test_counter = test_counter + 1;
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_1e0,&local_228,&local_208);
  __n_00 = domain;
  booster::locale::basic_message<char>::str
            ((string_type *)local_2c8,(basic_message<char> *)local_1e0,l,domain);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xba);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," bl::translate(c,original).str(l,domain)==expected",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar1 = error_counter + 1;
    __n_00 = (string *)(ulong)uVar1;
    bVar8 = 0x14 < error_counter;
    error_counter = uVar1;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_2f0);
  std::locale::global(&local_50);
  std::locale::~locale(&local_50);
  test_counter = test_counter + 1;
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_1e0,&local_228,&local_208);
  booster::locale::basic_message<char>::str
            ((string_type *)local_2c8,(basic_message<char> *)local_1e0,domain);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," bl::translate(c,original).str(domain)==expected",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar1 = error_counter + 1;
    __n_00 = (string *)(ulong)uVar1;
    bVar8 = 0x14 < error_counter;
    error_counter = uVar1;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_58);
  std::locale::~locale(&local_58);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  std::ios::imbue(&local_60);
  std::locale::~locale(&local_60);
  paVar2 = &local_248.field_2;
  pcVar3 = (domain->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + domain->_M_string_length);
  pbVar6 = booster::locale::as::details::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)local_1e0,
                      (set_domain *)&local_248);
  booster::locale::basic_message<char>::basic_message
            ((basic_message<char> *)local_2c8,&local_228,&local_208);
  booster::locale::basic_message<char>::write
            ((basic_message<char> *)local_2c8,(int)pbVar6,__buf_00,(size_t)__n_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_2c8);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170[0]._M_local_buf);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  std::ios::imbue(&local_68);
  std::locale::~locale(&local_68);
  pcVar3 = (domain->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + domain->_M_string_length);
  pbVar6 = booster::locale::as::details::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)local_1e0,
                      (set_domain *)&local_248);
  local_2c8._0_8_ = (ulong)(uint)local_2c8._4_4_ << 0x20;
  local_2c8._8_8_ = local_208._M_dataplus._M_p;
  local_2c8._16_8_ = local_228._M_dataplus._M_p;
  local_2c8._24_8_ = 0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_2a8._M_p = (pointer)&local_298;
  local_288._M_p = (pointer)&local_278;
  local_268._M_p = (pointer)&local_258;
  booster::locale::basic_message<char>::write
            ((basic_message<char> *)local_2c8,(int)pbVar6,local_208._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp((void *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_2c8);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170[0]._M_local_buf);
  std::locale::~locale(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void strings_equal(std::string n_c,std::string n_original,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type original = to<Char>(n_original.c_str());
    string_type c = to<Char>(n_c.c_str());
    if(domain=="default") {
        TEST(bl::translate(c,original).str(l)==expected);
        Char const *original_c_str=original.c_str(); // workaround gcc-3.4 bug
        Char const *context_c_str = c.c_str();
        TEST(bl::translate(context_c_str,original_c_str).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(c,original);
        TEST(tmp==expected);
        tmp=bl::translate(c,original).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(c,original);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(c,original).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(c,original).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c,original);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c.c_str(),original.c_str());
        TEST(ss.str()==expected);
    }
}